

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

Applicator * __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::GenMatcher::Substitution
::getApplicator(Substitution *this)

{
  Renaming *pRVar1;
  Applicator *pAVar2;
  
  if (this->_applicator == (Applicator *)0x0) {
    pAVar2 = (Applicator *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pRVar1 = this->_resultNormalizer;
    pAVar2->_parent = this->_parent;
    pAVar2->_resultNormalizer = pRVar1;
    (pAVar2->_cache)._timestamp = 1;
    *(undefined8 *)&(pAVar2->_cache)._nextExpansionOccupancy = 0;
    *(undefined8 *)((long)&(pAVar2->_cache)._entries + 4) = 0;
    (pAVar2->_cache)._size = 0;
    (pAVar2->_cache)._deleted = 0;
    (pAVar2->_cache)._capacityIndex = 0;
    (pAVar2->_cache)._capacity = 0;
    *(undefined4 *)((long)&(pAVar2->_cache)._afterLast + 4) = 0;
    this->_applicator = pAVar2;
  }
  return this->_applicator;
}

Assistant:

Applicator* getApplicator()
  {
    if(!_applicator) {
      _applicator=new Applicator(_parent, _resultNormalizer);
    }
    return _applicator;
  }